

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRecStart3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nVars;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Gia_Man_t *p;
  char *pcVar4;
  char *pcVar5;
  uint fVerbose;
  uint fFuncOnly;
  uint local_34;
  
  fFuncOnly = 0;
  Extra_UtilGetoptReset();
  local_34 = 0x20;
  nVars = 6;
  fVerbose = 0;
LAB_002128f8:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"KCfvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 < 0x4b) {
      if (iVar1 == -1) {
        if (nVars - 3 < 0xe) {
          iVar3 = Abc_NtkRecIsRunning3();
          if (iVar3 == 0) {
            if (argc - globalUtilOptind != 1) {
              p = (Gia_Man_t *)0x0;
              Abc_Print(1,"File name is not given on the command line. Starting a new record.\n");
              goto LAB_00212a74;
            }
            pcVar4 = argv[globalUtilOptind];
            pcVar5 = pcVar4;
            do {
              if (*pcVar5 == '>') {
                *pcVar5 = '\\';
              }
              else if (*pcVar5 == '\0') {
                __stream = fopen(pcVar4,"r");
                if (__stream == (FILE *)0x0) {
                  Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
                  pcVar4 = Extra_FileGetSimilarName
                                     (pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
                  ;
                  if (pcVar4 != (char *)0x0) {
                    Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
                  }
                  pcVar4 = "\n";
                  iVar3 = 1;
                  iVar1 = 1;
LAB_002129e7:
                  Abc_Print(iVar1,pcVar4);
                  return iVar3;
                }
                fclose(__stream);
                p = Gia_AigerRead(pcVar4,0,1,0);
                if (p == (Gia_Man_t *)0x0) {
                  Abc_Print(-1,"Reading AIGER has failed.\n");
                  return 0;
                }
LAB_00212a74:
                Abc_NtkRecStart3(p,nVars,local_34,fFuncOnly,fVerbose);
                return 0;
              }
              pcVar5 = pcVar5 + 1;
            } while( true );
          }
          pcVar4 = "The AIG subgraph recording is already started.\n";
        }
        else {
          pcVar4 = "The range of allowed values is 3 <= K <= 16.\n";
        }
        iVar3 = 0;
        iVar1 = -1;
        goto LAB_002129e7;
      }
      if (iVar1 != 0x43) goto LAB_00212b12;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00212b06:
        Abc_Print(-1,pcVar4);
        goto LAB_00212b12;
      }
      local_34 = atoi(argv[globalUtilOptind]);
      uVar2 = local_34;
    }
    else {
      if (iVar1 == 0x66) {
        fFuncOnly = fFuncOnly ^ 1;
        goto LAB_002128f8;
      }
      if (iVar1 != 0x4b) goto LAB_00212b12;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00212b06;
      }
      nVars = atoi(argv[globalUtilOptind]);
      uVar2 = nVars;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 1) {
LAB_00212b12:
      Abc_Print(-2,"usage: rec_start3 [-K num] [-C num] [-fvh] <file>\n");
      Abc_Print(-2,"\t         starts recording AIG subgraphs (should be called for\n");
      Abc_Print(-2,"\t         an empty network or after reading in a previous record)\n");
      Abc_Print(-2,"\t-K num : the largest number of inputs [default = %d]\n",(ulong)nVars);
      Abc_Print(-2,
                "\t-C num : the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n"
                ,(ulong)local_34);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fFuncOnly == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f     : toggles recording functions without AIG subgraphs [default = %s]\n",
                pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : AIGER file with the library\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRecStart3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew;
    FILE * pFile;
    Gia_Man_t * pGia = NULL;
    int nVars = 6;
    int nCuts = 32;
    int fFuncOnly = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCuts < 1 )
                goto usage;
            break;
        case 'f':
            fFuncOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !(nVars >= 3 && nVars <= 16) )
    {
        Abc_Print( -1, "The range of allowed values is 3 <= K <= 16.\n" );
        return 0;
    }
    if ( Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "The AIG subgraph recording is already started.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
        Abc_Print( 1, "File name is not given on the command line. Starting a new record.\n" );
    else
    {
        // get the input file name
        FileName = pArgvNew[0];
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGia = Gia_AigerRead( FileName, 0, 1, 0 );
        if ( pGia == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    Abc_NtkRecStart3( pGia, nVars, nCuts, fFuncOnly, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_start3 [-K num] [-C num] [-fvh] <file>\n" );
    Abc_Print( -2, "\t         starts recording AIG subgraphs (should be called for\n" );
    Abc_Print( -2, "\t         an empty network or after reading in a previous record)\n" );
    Abc_Print( -2, "\t-K num : the largest number of inputs [default = %d]\n", nVars );
    Abc_Print( -2, "\t-C num : the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n", nCuts );
    Abc_Print( -2, "\t-f     : toggles recording functions without AIG subgraphs [default = %s]\n", fFuncOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the library\n");
    return 1;
}